

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

optional<spv::Capability>
spvtools::opt::Handler_OpTypePointer_StoragePushConstant16(Instruction *instruction)

{
  IRContext *this;
  uint index;
  bool bVar1;
  uint32_t uVar2;
  _func_bool_Instruction_ptr *predicate;
  FeatureManager *feature_manager;
  _Optional_payload_base<spv::Capability> _Var3;
  
  if (instruction->opcode_ == OpTypePointer) {
    index = (instruction->has_result_id_ & 1) + 1;
    if (instruction->has_type_id_ == false) {
      index = (uint)instruction->has_result_id_;
    }
    predicate = (_func_bool_Instruction_ptr *)(ulong)index;
    uVar2 = Instruction::GetSingleWordOperand(instruction,index);
    _Var3._M_payload = (_Storage<spv::Capability,_true>)0x1153;
    _Var3._M_engaged = false;
    _Var3._5_3_ = 0;
    if (uVar2 == 9) {
      this = instruction->context_;
      feature_manager =
           (this->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      if (feature_manager == (FeatureManager *)0x0) {
        IRContext::AnalyzeFeatures(this);
        feature_manager =
             (this->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      }
      bVar1 = anon_unknown_0::Has16BitCapability(feature_manager);
      if (bVar1) {
        bVar1 = (anonymous_namespace)::AnyTypeOf<bool(*)(spvtools::opt::Instruction_const*)>
                          (instruction,predicate);
        _Var3 = (_Optional_payload_base<spv::Capability>)((ulong)bVar1 << 0x20 | 0x1153);
      }
    }
    return (optional<spv::Capability>)_Var3;
  }
  __assert_fail("instruction->opcode() == spv::Op::OpTypePointer && \"This handler only support OpTypePointer opcodes.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                ,0xbf,
                "std::optional<spv::Capability> spvtools::opt::Handler_OpTypePointer_StoragePushConstant16(const Instruction *)"
               );
}

Assistant:

static std::optional<spv::Capability>
Handler_OpTypePointer_StoragePushConstant16(const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpTypePointer &&
         "This handler only support OpTypePointer opcodes.");

  // This capability is only required if the variable has a PushConstant storage
  // class.
  spv::StorageClass storage_class = spv::StorageClass(
      instruction->GetSingleWordInOperand(kOpTypePointerStorageClassIndex));
  if (storage_class != spv::StorageClass::PushConstant) {
    return std::nullopt;
  }

  if (!Has16BitCapability(instruction->context()->get_feature_mgr())) {
    return std::nullopt;
  }

  return AnyTypeOf(instruction, is16bitType)
             ? std::optional(spv::Capability::StoragePushConstant16)
             : std::nullopt;
}